

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_171beb8::SatdLpTest_DISABLED_Speed_Test::TestBody
          (SatdLpTest_DISABLED_Speed_Test *this)

{
  uint uVar1;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  SEARCH_METHODS *message;
  bool bVar5;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  AssertHelper local_88;
  int local_7c;
  AssertionResult gtest_ar;
  int local_64;
  aom_usec_timer c_timer_;
  aom_usec_timer simd_timer_;
  
  SatdTestBase<short,_int_(*)(const_short_*,_int)>::FillRandom
            ((SatdTestBase<short,_int_(*)(const_short_*,_int)> *)this);
  iVar4 = 500000;
  printf("size = %d number of iteration is %d \n",
         (ulong)(uint)(this->super_SatdLpTest).
                      super_SatdTestBase<short,_int_(*)(const_short_*,_int)>.satd_size_,500000);
  ::aom_usec_timer_start(&c_timer_);
  uVar2 = extraout_RAX;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    uVar1 = (*(this->super_SatdLpTest).super_SatdTestBase<short,_int_(*)(const_short_*,_int)>.
              satd_func_ref_)((this->super_SatdLpTest).
                              super_SatdTestBase<short,_int_(*)(const_short_*,_int)>.src_,
                              (this->super_SatdLpTest).
                              super_SatdTestBase<short,_int_(*)(const_short_*,_int)>.satd_size_);
    uVar2 = (ulong)uVar1;
  }
  local_7c = (int)uVar2;
  ::aom_usec_timer_mark(&c_timer_);
  ::aom_usec_timer_start(&simd_timer_);
  iVar4 = 500000;
  uVar2 = extraout_RAX_00;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    uVar1 = (*(this->super_SatdLpTest).super_SatdTestBase<short,_int_(*)(const_short_*,_int)>.
              satd_func_simd_)((this->super_SatdLpTest).
                               super_SatdTestBase<short,_int_(*)(const_short_*,_int)>.src_,
                               (this->super_SatdLpTest).
                               super_SatdTestBase<short,_int_(*)(const_short_*,_int)>.satd_size_);
    uVar2 = (ulong)uVar1;
  }
  local_64 = (int)uVar2;
  ::aom_usec_timer_mark(&simd_timer_);
  uVar2 = ::aom_usec_timer_elapsed(&c_timer_);
  uVar3 = ::aom_usec_timer_elapsed(&simd_timer_);
  printf("c_time = %d \t simd_time = %d \t Gain = %4.2f \n",
         (double)((float)(int)uVar2 / (float)(int)uVar3),uVar2 & 0xffffffff,uVar3 & 0xffffffff);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"total_ref","total_simd",&local_7c,&local_64);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    std::operator<<((ostream *)(local_90._M_head_impl + 0x10),"Output mismatch \n");
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(SEARCH_METHODS **)
                 gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/avg_test.cc"
               ,0x3b6,(char *)message);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_P(SatdLpTest, DISABLED_Speed) {
  FillRandom();
  RunSpeedTest();
}